

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_scan.cpp
# Opt level: O3

InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
duckdb::TableScanToString_abi_cxx11_
          (InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,duckdb *this,TableFunctionToStringInput *input)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  char *pcVar4;
  string local_48;
  
  (__return_storage_ptr__->map).
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->map).
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->map).
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->map_idx)._M_h._M_buckets =
       &(__return_storage_ptr__->map_idx)._M_h._M_single_bucket;
  (__return_storage_ptr__->map_idx)._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->map_idx)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->map_idx)._M_h._M_element_count = 0;
  (__return_storage_ptr__->map_idx)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->map_idx)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->map_idx)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  optional_ptr<const_duckdb::FunctionData,_true>::CheckValid
            ((optional_ptr<const_duckdb::FunctionData,_true> *)(this + 8));
  lVar2 = *(long *)(this + 8);
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Table","");
  pbVar3 = InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator[](__return_storage_ptr__,&local_48);
  ::std::__cxx11::string::_M_assign((string *)pbVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  pcVar4 = "Sequential Scan";
  if (*(char *)(lVar2 + 0x28) != '\0') {
    pcVar4 = "Index Scan";
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Type","");
  pbVar3 = InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator[](__return_storage_ptr__,&local_48);
  ::std::__cxx11::string::_M_replace((ulong)pbVar3,0,(char *)pbVar3->_M_string_length,(ulong)pcVar4)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

InsertionOrderPreservingMap<string> TableScanToString(TableFunctionToStringInput &input) {
	InsertionOrderPreservingMap<string> result;
	auto &bind_data = input.bind_data->Cast<TableScanBindData>();
	result["Table"] = bind_data.table.name;
	result["Type"] = bind_data.is_index_scan ? "Index Scan" : "Sequential Scan";
	return result;
}